

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

int NextProtoSelectCallback(SSL *ssl,uint8_t **out,uint8_t *outlen,uint8_t *in,uint inlen,void *arg)

{
  int idx;
  void *pvVar1;
  
  idx = TestConfigExDataIndex();
  pvVar1 = SSL_get_ex_data((SSL *)ssl,idx);
  *out = *(uint8_t **)((long)pvVar1 + 0x248);
  *outlen = *(uint8_t *)((long)pvVar1 + 0x250);
  return 0;
}

Assistant:

static int NextProtoSelectCallback(SSL *ssl, uint8_t **out, uint8_t *outlen,
                                   const uint8_t *in, unsigned inlen,
                                   void *arg) {
  const TestConfig *config = GetTestConfig(ssl);
  *out = (uint8_t *)config->select_next_proto.data();
  *outlen = config->select_next_proto.size();
  return SSL_TLSEXT_ERR_OK;
}